

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
          (ImplicitProducer *this,BufferEvictionNode *element)

{
  bool bVar1;
  memory_order mVar2;
  ulong *puVar3;
  __pointer_type __p;
  Block *pBVar4;
  long *plVar5;
  long in_RDI;
  Block *newBlock;
  BlockIndexEntry *idxEntry;
  __int_type head;
  index_t newTailIndex;
  index_t currentTailIndex;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  BufferEvictionNode *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  memory_order in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff68;
  __pointer_type blockStartIndex;
  BlockIndexEntry **idx;
  BlockIndexEntry **idxEntry_00;
  int iVar7;
  int iVar8;
  
  puVar3 = (ulong *)(in_RDI + 0x20);
  iVar7 = 0;
  mVar2 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (iVar7 - 1U < 2) {
    idx = (BlockIndexEntry **)*puVar3;
  }
  else if (iVar7 == 5) {
    idx = (BlockIndexEntry **)*puVar3;
  }
  else {
    idx = (BlockIndexEntry **)*puVar3;
  }
  if (((ulong)idx & 0x1f) == 0) {
    __p = (__pointer_type)(in_RDI + 0x28);
    blockStartIndex = __p;
    idxEntry_00 = idx;
    iVar8 = iVar7;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    uVar6 = 0;
    bVar1 = details::circular_less_than<unsigned_long>
                      ((unsigned_long)
                       (((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                          *)__p->elements)->_M_b)._M_p,(unsigned_long)(idx + 4));
    if (!bVar1) {
      return false;
    }
    bVar1 = insert_block_index_entry<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                      ((ImplicitProducer *)CONCAT44(iVar8,mVar2),idxEntry_00,
                       (index_t)blockStartIndex);
    if (!bVar1) {
      return false;
    }
    pBVar4 = requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                       ((ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                         *)__p);
    if (pBVar4 == (Block *)0x0) {
      ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
      ImplicitProducer::rewind_block_index_tail
                ((ImplicitProducer *)CONCAT44(iVar7,in_stack_ffffffffffffff68));
      std::
      atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
      ::store((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
               *)CONCAT44(uVar6,in_stack_ffffffffffffff50),__p,in_stack_ffffffffffffff44);
      return false;
    }
    Block::
    reset_empty<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)0>
              ((Block *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    std::
    atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
    ::store((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
             *)CONCAT44(uVar6,in_stack_ffffffffffffff50),__p,in_stack_ffffffffffffff44);
    *(Block **)(in_RDI + 0x40) = pBVar4;
  }
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
  Block::operator[](*(Block **)(in_RDI + 0x40),(index_t)idx);
  duckdb::BufferEvictionNode::BufferEvictionNode
            ((BufferEvictionNode *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  plVar5 = (long *)(in_RDI + 0x20);
  std::operator&(memory_order_release,__memory_order_mask);
  *plVar5 = (long)idx + 1;
  return true;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#ifdef MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}